

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O1

void __thiscall cppnet::Dispatcher::Run(Dispatcher *this)

{
  element_type *peVar1;
  element_type *peVar2;
  uint uVar3;
  pthread_t pVar4;
  uint64_t uVar5;
  
  pVar4 = pthread_self();
  (this->_local_thread_id)._M_thread = pVar4;
  uVar5 = UTCTimeMsec();
  this->_cur_utc_time = uVar5;
  while( true ) {
    if (((this->super_Thread)._stop._M_base._M_i & 1U) != 0) {
      return;
    }
    uVar5 = UTCTimeMsec();
    peVar1 = (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_Timer[4])(peVar1,(ulong)(uint)((int)uVar5 - (int)this->_cur_utc_time));
    this->_cur_utc_time = uVar5;
    if (((this->super_Thread)._stop._M_base._M_i & 1U) != 0) break;
    uVar3 = (*((this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_Timer[2])();
    peVar2 = (this->_event_actions).
             super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_EventActions[10])(peVar2,(ulong)uVar3);
    DoTask(this);
  }
  return;
}

Assistant:

void Dispatcher::Run() {
    _local_thread_id = std::this_thread::get_id();
    _cur_utc_time = UTCTimeMsec();
    int32_t wait_time = 0;
    uint64_t cur_time = 0;

    while (!_stop) {
        cur_time = UTCTimeMsec();
        _timer->TimerRun(uint32_t(cur_time - _cur_utc_time));
        _cur_utc_time = cur_time;

        if (_stop) {
            break;
        }

        wait_time = _timer->MinTime();

        _event_actions->ProcessEvent(wait_time);

        DoTask();
    }
}